

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

bool __thiscall MeshLib::Solid::collapsable(Solid *this,HalfEdge *halfedge)

{
  bool bVar1;
  Edge **ppEVar2;
  Vertex **ppVVar3;
  Face **ppFVar4;
  HalfEdge **ppHVar5;
  size_type sVar6;
  bool *pbVar7;
  tVertex t;
  Vertex *local_160;
  Vertex *local_158;
  Vertex *v_1;
  VertexVertexIterator viter;
  Vertex *v;
  VertexVertexIterator vviter;
  List<MeshLib::Vertex> verts;
  HalfEdge *he_3;
  VertexInHalfedgeIterator rvhiter;
  HalfEdge *he_2;
  VertexInHalfedgeIterator lvhiter;
  HalfEdge *local_c0;
  HalfEdge *he_1;
  VertexInHalfedgeIterator svhiter;
  HalfEdge *he;
  undefined1 local_88 [8];
  VertexInHalfedgeIterator vhiter;
  vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> thlist;
  Vertex *vR;
  Vertex *vL;
  Face *fR;
  Face *fL;
  Vertex *target;
  Vertex *source;
  Edge *edge;
  HalfEdge *halfedge_local;
  Solid *this_local;
  
  edge = (Edge *)halfedge;
  halfedge_local = (HalfEdge *)this;
  ppEVar2 = HalfEdge::edge(halfedge);
  source = (Vertex *)*ppEVar2;
  ppVVar3 = HalfEdge::source((HalfEdge *)edge);
  target = *ppVVar3;
  ppVVar3 = HalfEdge::target((HalfEdge *)edge);
  fL = (Face *)*ppVVar3;
  ppFVar4 = HalfEdge::face((HalfEdge *)edge);
  fR = *ppFVar4;
  ppHVar5 = HalfEdge::he_sym((HalfEdge *)edge);
  if (*ppHVar5 == (HalfEdge *)0x0) {
    local_158 = (Vertex *)0x0;
  }
  else {
    ppHVar5 = HalfEdge::he_sym((HalfEdge *)edge);
    ppFVar4 = HalfEdge::face(*ppHVar5);
    local_158 = (Vertex *)*ppFVar4;
  }
  vL = local_158;
  ppHVar5 = HalfEdge::he_next((HalfEdge *)edge);
  ppVVar3 = HalfEdge::target(*ppHVar5);
  vR = *ppVVar3;
  ppHVar5 = HalfEdge::he_sym((HalfEdge *)edge);
  if (*ppHVar5 == (HalfEdge *)0x0) {
    local_160 = (Vertex *)0x0;
  }
  else {
    ppHVar5 = HalfEdge::he_sym((HalfEdge *)edge);
    ppHVar5 = HalfEdge::he_next(*ppHVar5);
    ppVVar3 = HalfEdge::target(*ppHVar5);
    local_160 = *ppVVar3;
  }
  thlist.super__Vector_base<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_160;
  std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::vector
            ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)&vhiter.m_halfedge
            );
  VertexInHalfedgeIterator::VertexInHalfedgeIterator
            ((VertexInHalfedgeIterator *)local_88,this,(tVertex *)&fL);
  while (bVar1 = VertexInHalfedgeIterator::end((VertexInHalfedgeIterator *)local_88),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    svhiter.m_halfedge = VertexInHalfedgeIterator::operator*((VertexInHalfedgeIterator *)local_88);
    ppFVar4 = HalfEdge::face(svhiter.m_halfedge);
    if ((*ppFVar4 != fR) && (ppFVar4 = HalfEdge::face(svhiter.m_halfedge), (Vertex *)*ppFVar4 != vL)
       ) {
      std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::push_back
                ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)
                 &vhiter.m_halfedge,&svhiter.m_halfedge);
    }
    VertexInHalfedgeIterator::operator++((VertexInHalfedgeIterator *)local_88);
  }
  VertexInHalfedgeIterator::~VertexInHalfedgeIterator((VertexInHalfedgeIterator *)local_88);
  VertexInHalfedgeIterator::VertexInHalfedgeIterator((VertexInHalfedgeIterator *)&he_1,this,&target)
  ;
  while (bVar1 = VertexInHalfedgeIterator::end((VertexInHalfedgeIterator *)&he_1),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_c0 = VertexInHalfedgeIterator::operator*((VertexInHalfedgeIterator *)&he_1);
    ppFVar4 = HalfEdge::face(local_c0);
    if ((*ppFVar4 != fR) && (ppFVar4 = HalfEdge::face(local_c0), (Vertex *)*ppFVar4 != vL)) {
      std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::push_back
                ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)
                 &vhiter.m_halfedge,&local_c0);
    }
    VertexInHalfedgeIterator::operator++((VertexInHalfedgeIterator *)&he_1);
  }
  VertexInHalfedgeIterator::~VertexInHalfedgeIterator((VertexInHalfedgeIterator *)&he_1);
  sVar6 = std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::size
                    ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)
                     &vhiter.m_halfedge);
  if (sVar6 == 0) {
    this_local._7_1_ = 0;
    lvhiter.m_halfedge._4_4_ = 1;
  }
  else {
    std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::clear
              ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)
               &vhiter.m_halfedge);
    VertexInHalfedgeIterator::VertexInHalfedgeIterator((VertexInHalfedgeIterator *)&he_2,this,&vR);
    while (bVar1 = VertexInHalfedgeIterator::end((VertexInHalfedgeIterator *)&he_2),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      rvhiter.m_halfedge = VertexInHalfedgeIterator::operator*((VertexInHalfedgeIterator *)&he_2);
      ppFVar4 = HalfEdge::face(rvhiter.m_halfedge);
      if ((*ppFVar4 != fR) &&
         (ppFVar4 = HalfEdge::face(rvhiter.m_halfedge), (Vertex *)*ppFVar4 != vL)) {
        std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::push_back
                  ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)
                   &vhiter.m_halfedge,&rvhiter.m_halfedge);
      }
      VertexInHalfedgeIterator::operator++((VertexInHalfedgeIterator *)&he_2);
    }
    lvhiter.m_halfedge._4_4_ = 8;
    VertexInHalfedgeIterator::~VertexInHalfedgeIterator((VertexInHalfedgeIterator *)&he_2);
    sVar6 = std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::size
                      ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)
                       &vhiter.m_halfedge);
    if (sVar6 == 0) {
      this_local._7_1_ = 0;
      lvhiter.m_halfedge._4_4_ = 1;
    }
    else {
      if (thlist.super__Vector_base<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::clear
                  ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)
                   &vhiter.m_halfedge);
        VertexInHalfedgeIterator::VertexInHalfedgeIterator
                  ((VertexInHalfedgeIterator *)&he_3,this,
                   (tVertex *)
                   &thlist.
                    super__Vector_base<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        while (bVar1 = VertexInHalfedgeIterator::end((VertexInHalfedgeIterator *)&he_3),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          verts._8_8_ = VertexInHalfedgeIterator::operator*((VertexInHalfedgeIterator *)&he_3);
          ppFVar4 = HalfEdge::face((HalfEdge *)verts._8_8_);
          if ((*ppFVar4 != fR) &&
             (ppFVar4 = HalfEdge::face((HalfEdge *)verts._8_8_), (Vertex *)*ppFVar4 != vL)) {
            std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::push_back
                      ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)
                       &vhiter.m_halfedge,(value_type *)&verts.m_size);
          }
          VertexInHalfedgeIterator::operator++((VertexInHalfedgeIterator *)&he_3);
        }
        lvhiter.m_halfedge._4_4_ = 0xb;
        VertexInHalfedgeIterator::~VertexInHalfedgeIterator((VertexInHalfedgeIterator *)&he_3);
        sVar6 = std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::size
                          ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)
                           &vhiter.m_halfedge);
        if (sVar6 == 0) {
          this_local._7_1_ = 0;
          lvhiter.m_halfedge._4_4_ = 1;
          goto LAB_0012517b;
        }
      }
      pbVar7 = Vertex::boundary(target);
      if ((((*pbVar7 & 1U) == 0) || (pbVar7 = Vertex::boundary((Vertex *)fL), (*pbVar7 & 1U) == 0))
         || (bVar1 = Edge::boundary((Edge *)source), bVar1)) {
        List<MeshLib::Vertex>::List((List<MeshLib::Vertex> *)&vviter.m_halfedge);
        VertexVertexIterator::VertexVertexIterator((VertexVertexIterator *)&v,target);
        while (bVar1 = VertexVertexIterator::end((VertexVertexIterator *)&v),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          viter.m_halfedge = (tHalfEdge)VertexVertexIterator::operator*((VertexVertexIterator *)&v);
          if (((Vertex *)viter.m_halfedge != vR) &&
             (viter.m_halfedge !=
              (tHalfEdge)
              thlist.super__Vector_base<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)) {
            List<MeshLib::Vertex>::Append
                      ((List<MeshLib::Vertex> *)&vviter.m_halfedge,(Vertex *)viter.m_halfedge);
          }
          VertexVertexIterator::operator++((VertexVertexIterator *)&v);
        }
        lvhiter.m_halfedge._4_4_ = 0xe;
        VertexVertexIterator::~VertexVertexIterator((VertexVertexIterator *)&v);
        VertexVertexIterator::VertexVertexIterator((VertexVertexIterator *)&v_1,(tVertex)fL);
        while (bVar1 = VertexVertexIterator::end((VertexVertexIterator *)&v_1),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          t = VertexVertexIterator::operator*((VertexVertexIterator *)&v_1);
          bVar1 = List<MeshLib::Vertex>::contains((List<MeshLib::Vertex> *)&vviter.m_halfedge,t);
          if (bVar1) {
            this_local._7_1_ = 0;
            lvhiter.m_halfedge._4_4_ = 1;
            goto LAB_00125138;
          }
          VertexVertexIterator::operator++((VertexVertexIterator *)&v_1);
        }
        lvhiter.m_halfedge._4_4_ = 0x11;
LAB_00125138:
        VertexVertexIterator::~VertexVertexIterator((VertexVertexIterator *)&v_1);
        if (lvhiter.m_halfedge._4_4_ == 0x11) {
          this_local._7_1_ = 1;
          lvhiter.m_halfedge._4_4_ = 1;
        }
        List<MeshLib::Vertex>::~List((List<MeshLib::Vertex> *)&vviter.m_halfedge);
      }
      else {
        this_local._7_1_ = 0;
        lvhiter.m_halfedge._4_4_ = 1;
      }
    }
  }
LAB_0012517b:
  std::vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_>::~vector
            ((vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> *)&vhiter.m_halfedge
            );
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Solid::collapsable (HalfEdge * halfedge) {
	Edge * edge = halfedge->edge ();
	Vertex * source = halfedge->source ();
	Vertex * target = halfedge->target ();
	Face * fL = halfedge->face ();
	Face * fR = halfedge->he_sym ()!= NULL?halfedge->he_sym()->face ():NULL;
	Vertex * vL = halfedge->he_next ()->target ();
	Vertex * vR = halfedge->he_sym ()!= NULL? halfedge->he_sym ()->he_next ()->target ():NULL;
	std::vector <HalfEdge *> thlist;
	for( VertexInHalfedgeIterator vhiter( this, target );!vhiter.end(); ++ vhiter ) {
		HalfEdge * he = *vhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}

	for( VertexInHalfedgeIterator svhiter( this, source );!svhiter.end(); ++ svhiter ) {
		HalfEdge * he = *svhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}
	if(thlist.size () == 0) return false;

	thlist.clear ();
	for( VertexInHalfedgeIterator lvhiter( this, vL );!lvhiter.end(); ++ lvhiter )
	{
		HalfEdge * he = *lvhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}
	if(thlist.size () == 0) return false;
	if( vR != NULL ) {
		thlist.clear ();
		for( VertexInHalfedgeIterator rvhiter( this, vR );!rvhiter.end(); ++ rvhiter ) {
			HalfEdge * he = *rvhiter;

			if( he->face() == fL ) continue;
			if( he->face() == fR ) continue;

			thlist.push_back ( he );
		}
		if(thlist.size () == 0) return false;
	}

	if( source->boundary() && target->boundary() && !edge->boundary() )
		return false;

	List<Vertex> verts;

	for( VertexVertexIterator vviter( source ); !vviter.end(); ++ vviter ) {
		Vertex * v = *vviter;
		if( v == vL ) continue;
		if( v == vR ) continue;
		verts.Append( v );
	}

	for( VertexVertexIterator viter(  target ); !viter.end(); ++ viter ) {
		Vertex * v = *viter;
		if( verts.contains( v ) ) return false;
	}

	return true;
}